

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O2

void __thiscall
cs::compiler_type::process_line
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *line)

{
  _Elt_pointer pptVar1;
  
  process_brackets(this,line);
  pptVar1 = (line->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (pptVar1 ==
      (line->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar1 = (line->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
              .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  kill_brackets(this,line,pptVar1[-1]->line_num);
  kill_expr(this,line);
  return;
}

Assistant:

void process_line(std::deque<token_base *> &line)
		{
			process_brackets(line);
			kill_brackets(line, static_cast<token_endline *>(line.back())->get_line_num());
			kill_expr(line);
		}